

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O3

void int_trp_fatal(int line,char *file,char *format,...)

{
  long lVar1;
  _Alloc_hider _Var2;
  char *file_00;
  char in_AL;
  bool bVar3;
  int iVar4;
  undefined8 in_RCX;
  char *pcVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  char *__s;
  size_t sVar6;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_138 [24];
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  va_list values;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  string local_60;
  char *local_40;
  int local_34;
  
  if (in_AL != '\0') {
    local_108 = in_XMM0_Qa;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  sVar6 = 0x400;
  __s = local_138;
  local_120 = in_RCX;
  local_118 = in_R8;
  local_110 = in_R9;
  local_40 = file;
  local_34 = line;
  do {
    pcVar5 = __s;
    lVar1 = -sVar6;
    __s = pcVar5 + lVar1;
    values[0].overflow_arg_area = local_138;
    values[0]._0_8_ = &stack0x00000008;
    local_88 = 0x3000000018;
    builtin_strncpy(pcVar5 + lVar1 + -8,"5&\x12",4);
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    iVar4 = vsnprintf(__s,sVar6,format,&local_88);
    if (iVar4 < 0) {
      sVar6 = (size_t)((int)sVar6 + 0x400);
    }
    builtin_strncpy(pcVar5 + lVar1 + -8,"K&\x12",4);
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    bVar3 = IsMsgSizeOk((uint32_t)sVar6);
  } while ((iVar4 < 0) && (bVar3));
  builtin_strncpy(pcVar5 + lVar1 + -8,"`&\x12",4);
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  trun::TestRunner::GetCurrentTestModule();
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  builtin_strncpy(pcVar5 + lVar1 + -8,"s&\x12",4);
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  sVar6 = strlen(__s);
  __s[-8] = -0x7d;
  __s[-7] = '&';
  __s[-6] = '\x12';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,__s,__s + sVar6);
  iVar4 = local_34;
  file_00 = local_40;
  __s[-8] = -99;
  __s[-7] = '&';
  __s[-6] = '\x12';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  trun::TestResponseProxy::Fatal
            ((TestResponseProxy *)((long)values[0].reg_save_area + 0xa0),iVar4,file_00,&local_60);
  _Var2._M_p = local_60._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    __s[-8] = -0x4e;
    __s[-7] = '&';
    __s[-6] = '\x12';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    operator_delete(_Var2._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __s[-8] = -0x40;
    __s[-7] = '&';
    __s[-6] = '\x12';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  return;
}

Assistant:

static void int_trp_fatal(int line, const char *file, const char *format, ...) {
    CREATE_REPORT_STRING()
    TestRunner::GetCurrentTestModule()->GetTestResponseProxy().Fatal(line, file, std::string(newstr));
}